

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_upvaluejoin(lua_State *L,int fidx1,int n1,int fidx2,int n2)

{
  UpVal **ppUVar1;
  UpVal **ppUVar2;
  UpVal **up2;
  UpVal **up1;
  LClosure *f1;
  int n2_local;
  int fidx2_local;
  int n1_local;
  int fidx1_local;
  lua_State *L_local;
  
  f1._0_4_ = n2;
  f1._4_4_ = fidx2;
  n2_local = n1;
  fidx2_local = fidx1;
  _n1_local = L;
  ppUVar1 = getupvalref(L,fidx1,n1,(LClosure **)&up1);
  ppUVar2 = getupvalref(_n1_local,f1._4_4_,(int)f1,(LClosure **)0x0);
  luaC_upvdeccount(_n1_local,*ppUVar1);
  *ppUVar1 = *ppUVar2;
  (*ppUVar1)->refcount = (*ppUVar1)->refcount + 1;
  if ((*ppUVar1)->v != (TValue *)&(*ppUVar1)->u) {
    ((*ppUVar1)->u).open.touched = 1;
  }
  if ((((*ppUVar1)->v->tt_ & 0x40U) != 0) && ((*ppUVar1)->v == (TValue *)&(*ppUVar1)->u)) {
    luaC_upvalbarrier_(_n1_local,*ppUVar1);
  }
  return;
}

Assistant:

LUA_API void lua_upvaluejoin(lua_State *L, int fidx1, int n1,
                             int fidx2, int n2) {
    LClosure *f1;
    UpVal **up1 = getupvalref(L, fidx1, n1, &f1);
    UpVal **up2 = getupvalref(L, fidx2, n2, NULL);
    luaC_upvdeccount(L, *up1);
    *up1 = *up2;
    (*up1)->refcount++;
    if (upisopen(*up1)) (*up1)->u.open.touched = 1;
    luaC_upvalbarrier(L, *up1);
}